

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

void __thiscall QList<QTzTransition>::QList(QList<QTzTransition> *this,qsizetype size)

{
  qint64 *pqVar1;
  qint64 qVar2;
  QTzTransition *b;
  QTzTransition *pQVar3;
  long lVar4;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayData *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar3 = (QTzTransition *)QArrayData::allocate(&local_28,0x10,0x10,size,KeepSize);
  (this->d).d = (Data *)local_28;
  (this->d).ptr = pQVar3;
  (this->d).size = 0;
  if (size != 0) {
    pQVar3->tz_time = 0;
    *(undefined8 *)&pQVar3->tz_typeind = 0;
    if (size != 1) {
      lVar4 = 0x10;
      do {
        qVar2 = *(qint64 *)&pQVar3->tz_typeind;
        pqVar1 = (qint64 *)((long)&pQVar3->tz_time + lVar4);
        *pqVar1 = pQVar3->tz_time;
        pqVar1[1] = qVar2;
        lVar4 = lVar4 + 0x10;
      } while (size << 4 != lVar4);
    }
    (this->d).size = size;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit QList(qsizetype size)
        : d(size)
    {
        if (size)
            d->appendInitialize(size);
    }